

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Any::Any<std::shared_ptr<int_const>const&,void>
          (Any *this,shared_ptr<const_int> *t_value)

{
  shared_ptr<const_int> local_20;
  shared_ptr<const_int> *t_value_local;
  Any *this_local;
  
  local_20.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_value;
  t_value_local = (shared_ptr<const_int> *)this;
  std::
  make_unique<chaiscript::detail::Any::Data_Impl<std::shared_ptr<int_const>>,std::shared_ptr<int_const>const&>
            (&local_20);
  std::unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
  ::
  unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<int_const>>,std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<int_const>>>,void>
            ((unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
              *)this,(unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<const_int>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<const_int>_>_>_>
                      *)&local_20);
  std::
  unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<const_int>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<const_int>_>_>_>
  ::~unique_ptr((unique_ptr<chaiscript::detail::Any::Data_Impl<std::shared_ptr<const_int>_>,_std::default_delete<chaiscript::detail::Any::Data_Impl<std::shared_ptr<const_int>_>_>_>
                 *)&local_20);
  return;
}

Assistant:

explicit Any(ValueType &&t_value)
          : m_data(std::make_unique<Data_Impl<std::decay_t<ValueType>>>(std::forward<ValueType>(t_value))) {
      }